

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isgraph.c
# Opt level: O2

int main(void)

{
  _PDCLIB_lc_ctype_entry_t *p_Var1;
  
  p_Var1 = _PDCLIB_lc_ctype->entry;
  if ((p_Var1[0x61].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1a,"isgraph( \'a\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x7a].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1b,"isgraph( \'z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x41].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1c,"isgraph( \'A\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x5a].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1d,"isgraph( \'Z\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x40].flags & 8) == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1e,"isgraph( \'@\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[9].flags & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1f,"! isgraph( \'\\t\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1->flags & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x20,"! isgraph( \'\\0\' )");
    p_Var1 = _PDCLIB_lc_ctype->entry;
  }
  if ((p_Var1[0x20].flags & 8) != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x21,"! isgraph( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isgraph( 'a' ) );
    TESTCASE( isgraph( 'z' ) );
    TESTCASE( isgraph( 'A' ) );
    TESTCASE( isgraph( 'Z' ) );
    TESTCASE( isgraph( '@' ) );
    TESTCASE( ! isgraph( '\t' ) );
    TESTCASE( ! isgraph( '\0' ) );
    TESTCASE( ! isgraph( ' ' ) );
    return TEST_RESULTS;
}